

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O2

SessionFactory *
FileSendSession::create_session_factory(SessionFactory *__return_storage_ptr__,path *path)

{
  string *this;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)path);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,asStack_38);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileSendSession.cpp:57:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileSendSession.cpp:57:10)>
       ::_M_manager;
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

TCPServer::SessionFactory FileSendSession::create_session_factory(const fs::path &path) {
  return [=](Poll &p, TCPServer &server, sockaddr_in client) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileSendSession>(path);
    s->when_success([](auto a) { std::cout << "Sent file " << a << std::endl; });
    s->when_error([](auto a) { std::cout << "Could not send file " << a << std::endl; });
    return s;
  };
}